

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isTaggedUnion(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  long lVar3;
  
  pTVar2 = getCanonicalType(this);
  SVar1 = (pTVar2->super_Symbol).kind;
  if (SVar1 == PackedUnionType) {
    lVar3 = 0x8c;
  }
  else {
    if (SVar1 != UnpackedUnionType) {
      return false;
    }
    lVar3 = 0xa4;
  }
  return (bool)*(undefined1 *)((long)&(pTVar2->super_Symbol).kind + lVar3);
}

Assistant:

bool Type::isTaggedUnion() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedUnionType:
            return ct.as<PackedUnionType>().isTagged;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().isTagged;
        default:
            return false;
    }
}